

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::end_scope_decl(CompilerGLSL *this,string *decl)

{
  CompilerError *this_00;
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *decl_local;
  CompilerGLSL *this_local;
  
  local_18 = decl;
  decl_local = (string *)this;
  if (this->indent == 0) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"Popping empty indent stack.",&local_39);
    CompilerError::CompilerError(this_00,(string *)local_38);
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  this->indent = this->indent - 1;
  statement<char_const(&)[3],std::__cxx11::string_const&,char_const(&)[2]>
            (this,(char (*) [3])"} ",decl,(char (*) [2])0x4d9ce2);
  return;
}

Assistant:

void CompilerGLSL::end_scope_decl(const string &decl)
{
	if (!indent)
		SPIRV_CROSS_THROW("Popping empty indent stack.");
	indent--;
	statement("} ", decl, ";");
}